

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool run_container_add(run_container_t *run,uint16_t pos)

{
  rle16_t *prVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  uint unaff_EBP;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  prVar1 = run->runs;
  iVar4 = run->n_runs;
  iVar6 = iVar4 + -1;
  uVar8 = 0;
  do {
    if (iVar6 < (int)uVar8) {
      uVar7 = ~uVar8;
      break;
    }
    uVar7 = uVar8 + iVar6 >> 1;
    if (prVar1[uVar7].value < pos) {
      uVar8 = uVar7 + 1;
      bVar2 = true;
      uVar7 = unaff_EBP;
    }
    else if (pos < prVar1[uVar7].value) {
      iVar6 = uVar7 - 1;
      bVar2 = true;
      uVar7 = unaff_EBP;
    }
    else {
      bVar2 = false;
    }
    unaff_EBP = uVar7;
  } while (bVar2);
  if (-1 < (int)uVar7) {
    bVar3 = 0;
    goto LAB_00110586;
  }
  if (uVar7 == 0xffffffff) {
    if (run->n_runs < 1) goto LAB_00110534;
    prVar1 = run->runs;
    if (pos + 1 != (uint)prVar1->value) goto LAB_00110534;
    prVar1->length = prVar1->length + 1;
    prVar1->value = prVar1->value - 1;
  }
  else {
    uVar8 = -uVar7 - 2;
    iVar6 = (uint)pos - (uint)prVar1[uVar8].value;
    if ((int)(uint)prVar1[uVar8].length < iVar6) {
      uVar9 = ~uVar7;
      if (iVar6 == prVar1[uVar8].length + 1) {
        if ((int)uVar9 < iVar4) {
          if (pos + 1 == (uint)prVar1[uVar9].value) {
            prVar1[uVar8].length =
                 (prVar1[uVar9].value - prVar1[uVar8].value) + prVar1[uVar9].length;
            memmove(prVar1 + (uVar9 & 0xffff),prVar1 + (ulong)(uVar9 & 0xffff) + 1,
                    (long)(int)((uVar7 | 0xffff0000) + iVar4) << 2);
            run->n_runs = run->n_runs + -1;
            goto LAB_0011052a;
          }
        }
        prVar1[uVar8].length = prVar1[uVar8].length + 1;
      }
      else {
        bVar2 = true;
        if ((iVar4 <= (int)uVar9) || (pos + 1 != (uint)prVar1[uVar9].value)) goto LAB_00110530;
        prVar1[uVar9].value = pos;
        prVar1[uVar9].length = prVar1[uVar9].length + 1;
      }
LAB_0011052a:
      iVar4 = 1;
      bVar2 = false;
    }
    else {
      bVar2 = false;
      iVar4 = 0;
    }
LAB_00110530:
    bVar3 = (byte)iVar4;
    if (!bVar2) goto LAB_00110586;
LAB_00110534:
    uVar7 = ~uVar7;
    if (run->capacity <= run->n_runs) {
      run_container_grow(run,run->n_runs + 1,true);
    }
    uVar5 = (ulong)(uVar7 & 0xffff);
    memmove(run->runs + uVar5 + 1,run->runs + uVar5,((long)run->n_runs - uVar5) * 4);
    run->n_runs = run->n_runs + 1;
    prVar1 = run->runs;
    prVar1[uVar7].value = pos;
    prVar1[uVar7].length = 0;
  }
  bVar3 = 1;
LAB_00110586:
  return (_Bool)(bVar3 & 1);
}

Assistant:

bool run_container_add(run_container_t *run, uint16_t pos) {
    int32_t index = interleavedBinarySearch(run->runs, run->n_runs, pos);
    if (index >= 0) return false;  // already there
    index = -index - 2;            // points to preceding value, possibly -1
    if (index >= 0) {              // possible match
        int32_t offset = pos - run->runs[index].value;
        int32_t le = run->runs[index].length;
        if (offset <= le) return false;  // already there
        if (offset == le + 1) {
            // we may need to fuse
            if (index + 1 < run->n_runs) {
                if (run->runs[index + 1].value == pos + 1) {
                    // indeed fusion is needed
                    run->runs[index].length = run->runs[index + 1].value +
                                              run->runs[index + 1].length -
                                              run->runs[index].value;
                    recoverRoomAtIndex(run, (uint16_t)(index + 1));
                    return true;
                }
            }
            run->runs[index].length++;
            return true;
        }
        if (index + 1 < run->n_runs) {
            // we may need to fuse
            if (run->runs[index + 1].value == pos + 1) {
                // indeed fusion is needed
                run->runs[index + 1].value = pos;
                run->runs[index + 1].length = run->runs[index + 1].length + 1;
                return true;
            }
        }
    }
    if (index == -1) {
        // we may need to extend the first run
        if (0 < run->n_runs) {
            if (run->runs[0].value == pos + 1) {
                run->runs[0].length++;
                run->runs[0].value--;
                return true;
            }
        }
    }
    makeRoomAtIndex(run, (uint16_t)(index + 1));
    run->runs[index + 1].value = pos;
    run->runs[index + 1].length = 0;
    return true;
}